

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder_init__internal
                    (ma_decoder_read_proc onRead,ma_decoder_seek_proc onSeek,void *pUserData,
                    ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  uint uVar1;
  ma_result mVar2;
  ma_result mVar3;
  size_t *psVar4;
  
  uVar1 = *(uint *)(onSeek + 0x70);
  psVar4 = (size_t *)(ulong)uVar1;
  if (uVar1 == 0) {
LAB_001704ed:
    mVar2 = ma_decoder_init_custom__internal((ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
    if (mVar2 != MA_SUCCESS) {
      (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar4);
    }
    if (*(int *)(onSeek + 0x70) != 0) {
      return MA_NO_BACKEND;
    }
    if (mVar2 != MA_SUCCESS) {
      psVar4 = (size_t *)pUserData;
      mVar3 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_wav,(void *)0x0,(ma_decoder_config *)onSeek,
                         (ma_decoder *)pUserData);
      mVar2 = MA_SUCCESS;
      if (mVar3 != MA_SUCCESS) {
        (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar4);
        psVar4 = (size_t *)pUserData;
        mVar3 = ma_decoder_init_from_vtable__internal
                          (&g_ma_decoding_backend_vtable_flac,(void *)0x0,
                           (ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
        mVar2 = MA_SUCCESS;
        if (mVar3 != MA_SUCCESS) {
          (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar4);
          psVar4 = (size_t *)pUserData;
          mVar3 = ma_decoder_init_from_vtable__internal
                            (&g_ma_decoding_backend_vtable_mp3,(void *)0x0,
                             (ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
          mVar2 = MA_SUCCESS;
          if (mVar3 != MA_SUCCESS) {
            (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar4);
            psVar4 = (size_t *)pUserData;
            mVar3 = ma_decoder_init_from_vtable__internal
                              (&g_ma_decoding_backend_vtable_stbvorbis,(void *)0x0,
                               (ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
            mVar2 = MA_SUCCESS;
            if (mVar3 != MA_SUCCESS) {
              (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar4);
              mVar2 = mVar3;
            }
          }
        }
      }
      goto LAB_001705c3;
    }
  }
  else {
    mVar2 = MA_NO_BACKEND;
    if (uVar1 == 1) {
      psVar4 = (size_t *)pUserData;
      mVar2 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_wav,(void *)0x0,(ma_decoder_config *)onSeek,
                         (ma_decoder *)pUserData);
    }
    if (*(int *)(onSeek + 0x70) == 2) {
      psVar4 = (size_t *)pUserData;
      mVar2 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_flac,(void *)0x0,(ma_decoder_config *)onSeek,
                         (ma_decoder *)pUserData);
    }
    if (*(int *)(onSeek + 0x70) == 3) {
      psVar4 = (size_t *)pUserData;
      mVar2 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_mp3,(void *)0x0,(ma_decoder_config *)onSeek,
                         (ma_decoder *)pUserData);
    }
    if (*(int *)(onSeek + 0x70) == 4) {
      psVar4 = (size_t *)pUserData;
      mVar2 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_stbvorbis,(void *)0x0,
                         (ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
    }
    if (mVar2 != MA_SUCCESS) {
      (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar4);
      goto LAB_001704ed;
    }
  }
  mVar2 = MA_SUCCESS;
LAB_001705c3:
  if (mVar2 != MA_SUCCESS) {
    return mVar2;
  }
  mVar2 = ma_decoder__postinit((ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
  return mVar2;
}

Assistant:

static ma_result ma_decoder_init__internal(ma_decoder_read_proc onRead, ma_decoder_seek_proc onSeek, void* pUserData, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result = MA_NO_BACKEND;

    MA_ASSERT(pConfig != NULL);
    MA_ASSERT(pDecoder != NULL);

    /* Silence some warnings in the case that we don't have any decoder backends enabled. */
    (void)onRead;
    (void)onSeek;
    (void)pUserData;


    /* If we've specified a specific encoding type, try that first. */
    if (pConfig->encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (pConfig->encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav__internal(pConfig, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (pConfig->encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac__internal(pConfig, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (pConfig->encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3__internal(pConfig, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (pConfig->encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis__internal(pConfig, pDecoder);
        }
    #endif

        /* If we weren't able to initialize the decoder, seek back to the start to give the next attempts a clean start. */
        if (result != MA_SUCCESS) {
            onSeek(pDecoder, 0, ma_seek_origin_start);
        }
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we couldn't load a specific decoding backend based on the encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_custom__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (pConfig->encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_wav__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_flac__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_mp3__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_vorbis__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    }

    if (result != MA_SUCCESS) {
        return result;
    }

    return ma_decoder__postinit(pConfig, pDecoder);
}